

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O3

int send_flow(SESSION_INSTANCE *session)

{
  int iVar1;
  int extraout_EAX;
  FLOW_HANDLE in_RAX;
  AMQP_VALUE performative;
  
  if (session != (SESSION_INSTANCE *)0x0) {
    in_RAX = flow_create(session->incoming_window,session->next_outgoing_id,session->outgoing_window
                        );
    if (in_RAX != (FLOW_HANDLE)0x0) {
      iVar1 = flow_set_next_incoming_id(in_RAX,session->next_incoming_id);
      if (iVar1 == 0) {
        performative = amqpvalue_create_flow(in_RAX);
        if (performative != (AMQP_VALUE)0x0) {
          connection_encode_frame
                    (session->endpoint,performative,(PAYLOAD *)0x0,0,(ON_SEND_COMPLETE)0x0,
                     (void *)0x0);
          amqpvalue_destroy(performative);
        }
      }
      flow_destroy(in_RAX);
      return extraout_EAX;
    }
  }
  return (int)in_RAX;
}

Assistant:

static int send_flow(LINK_INSTANCE* link)
{
    int result;
    FLOW_HANDLE flow = flow_create(0, 0, 0);

    if (flow == NULL)
    {
        LogError("NULL flow performative");
        result = MU_FAILURE;
    }
    else
    {
        if (flow_set_link_credit(flow, link->current_link_credit) != 0)
        {
            LogError("Cannot set link credit on flow performative");
            result = MU_FAILURE;
        }
        else if (flow_set_handle(flow, link->handle) != 0)
        {
            LogError("Cannot set handle on flow performative");
            result = MU_FAILURE;
        }
        else if (flow_set_delivery_count(flow, link->delivery_count) != 0)
        {
            LogError("Cannot set delivery count on flow performative");
            result = MU_FAILURE;
        }
        else
        {
            if (session_send_flow(link->link_endpoint, flow) != 0)
            {
                LogError("Sending flow frame failed in session send");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }

        flow_destroy(flow);
    }

    return result;
}